

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O0

bool __thiscall Core::keysCheck(Core *this)

{
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  Core *local_18;
  Core *this_local;
  
  local_18 = this;
  bVar1 = Parsing::Parser::loadKeys(&this->_p);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Missing keyword_lists.txt in rsrc!",&local_39);
    this_local._7_1_ = error(this,&local_38,true);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Core::keysCheck()
{
    if (!_p.loadKeys())
        return error("Missing keyword_lists.txt in rsrc!", true);
    return true;
}